

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O3

void implementations::scheme::repl(string *prompt,env_p *env)

{
  char cVar1;
  ostream *poVar2;
  size_t __nbytes;
  cell *exp;
  string line;
  char local_131;
  undefined1 *local_130;
  undefined8 local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  env_p local_110;
  string local_100;
  cell local_e0;
  cell local_88;
  
  do {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(prompt->_M_dataplus)._M_p,prompt->_M_string_length);
      local_130 = &local_120;
      local_128 = 0;
      local_120 = 0;
      cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x10);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&local_130,cVar1);
      read((int)&local_e0,(string *)&local_130,__nbytes);
      local_110.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (env->
                super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
      local_110.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (env->
           super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_110.
          super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_110.
           super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_110.
                super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_110.
           super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_110.
                super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      eval(&local_88,&local_e0,&local_110);
      to_string_abi_cxx11_(&local_100,(scheme *)&local_88,exp);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_100._M_dataplus._M_p,
                          local_100._M_string_length);
      local_131 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_131,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if (local_88.env.
          super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.env.
                   super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      ~vector(&local_88.list);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.val._M_dataplus._M_p != &local_88.val.field_2) {
        operator_delete(local_88.val._M_dataplus._M_p,local_88.val.field_2._M_allocated_capacity + 1
                       );
      }
      if (local_110.
          super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_110.
                   super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_e0.env.
          super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e0.env.
                   super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      ~vector(&local_e0.list);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.val._M_dataplus._M_p != &local_e0.val.field_2) {
        operator_delete(local_e0.val._M_dataplus._M_p,local_e0.val.field_2._M_allocated_capacity + 1
                       );
      }
    } while (local_130 == &local_120);
    operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
  } while( true );
}

Assistant:

void repl(const std::string & prompt, env_p env)
{
	for (;;) {
		std::cout << prompt;
		std::string line; std::getline(std::cin, line);
		std::cout << to_string(eval(read(line), env)) << '\n';
	}
}